

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void krawtchouk(int n,double p,double x,int m,double *v)

{
  int local_34;
  int i;
  double *v_local;
  int m_local;
  double x_local;
  double p_local;
  int n_local;
  
  if (n < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"KRAWTCHOUK - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  0 <= N is required.\n");
    exit(1);
  }
  if ((0.0 < p) && (p < 1.0)) {
    if (m < 0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"KRAWTCHOUK - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  0 <= M is required.\n");
      exit(1);
    }
    *v = 1.0;
    if (0 < n) {
      v[1] = -p * (double)m + x;
    }
    for (local_34 = 1; local_34 < n; local_34 = local_34 + 1) {
      v[local_34 + 1] =
           ((x - (p * (double)(m + local_34 * -2) + (double)local_34)) * v[local_34] +
           -((double)((m - local_34) + 1) * p * (1.0 - p) * v[local_34 + -1])) /
           (double)(local_34 + 1);
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"KRAWTCHOUK - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  0 < P < 1 is required.\n");
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void krawtchouk ( int n, double p, double x, int m, double v[] )

//****************************************************************************80
//
//  Purpose:
//
//    KRAWTCHOUK evaluates the Krawtchouk polynomials at X.
//
//  Discussion:
//
//    The polynomial has a parameter P, which must be striclty between
//    0 and 1, and a parameter M which must be a nonnegative integer.
//
//    The Krawtchouk polynomial of order N, with parameters P and M,
//    evaluated at X, may be written K(N,P,X,M).
//
//    The first two terms are:
//
//      K(0,P,X,M) = 1
//      K(1,P,X,M) = X - P * M
//
//    and the recursion, for fixed P and M is
//
//                             ( N + 1 ) * K(N+1,P,X,M) =
//        ( X - ( N + P * ( M - 2 * N))) * K(N,  P,X,M)
//       - ( M - N + 1 ) * P * ( 1 - P ) * K(N-1,P,X,M)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 March 2009
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Walter Gautschi,
//    Orthogonal Polynomials: Computation and Approximation,
//    Oxford, 2004,
//    ISBN: 0-19-850672-4,
//    LC: QA404.5 G3555.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to evaluate.
//    0 <= N.
//
//    Input, double P, the parameter.  0 < P < 1.
//
//    Input, double X, the evaluation parameter.
//
//    Input, int M, the parameter.  0 <= M.
//
//    Output, double V[N+1], the values of the Krawtchouk polynomials
//    of orders 0 through N at X.
//
{
  int i;

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "KRAWTCHOUK - Fatal error!\n";
    std::cerr << "  0 <= N is required.\n";
    exit ( 1 );
  }

  if ( p <= 0.0 || 1.0 <= p )
  {
    std::cerr << "\n";
    std::cerr << "KRAWTCHOUK - Fatal error!\n";
    std::cerr << "  0 < P < 1 is required.\n";
    exit ( 1 );
  }

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "KRAWTCHOUK - Fatal error!\n";
    std::cerr << "  0 <= M is required.\n";
    exit ( 1 );
  }

  v[0] = 1.0;

  if ( 1 <= n )
  {
    v[1] = x - p * double( m );
  }

  for ( i = 1; i < n; i++ )
  {
    v[i+1] = ( 
      ( x - ( double( i ) + p * double( m - 2 * i ) ) ) * v[i] 
      - double( m - i + 1 ) * p * ( 1.0 - p ) * v[i-1]
      ) / double( i + 1 );
  }

  return;
}